

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib590.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  long lVar2;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 != 0) {
      iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
      if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x2a,1), iVar1 == 0)) &&
          (iVar1 = curl_easy_setopt(lVar2,0x6f,0xb), iVar1 == 0)) &&
         ((iVar1 = curl_easy_setopt(lVar2,0x2714,libtest_arg2), iVar1 == 0 &&
          (iVar1 = curl_easy_setopt(lVar2,0x2716,"me:password"), iVar1 == 0)))) {
        iVar1 = curl_easy_perform(lVar2);
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_PROXYAUTH,
              (long) (CURLAUTH_BASIC | CURLAUTH_DIGEST | CURLAUTH_NTLM));
  test_setopt(curl, CURLOPT_PROXY, libtest_arg2); /* set in first.c */
  test_setopt(curl, CURLOPT_PROXYUSERPWD, "me:password");

  res = curl_easy_perform(curl);

  test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}